

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O3

char * Curl_all_content_encodings(void)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  
  iVar1 = Curl_strcasecompare("identity","identity");
  if (iVar1 != 0) {
    pcVar2 = (*Curl_cstrdup)("identity");
    return pcVar2;
  }
  pcVar2 = (char *)(*Curl_cmalloc)(10);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    iVar1 = Curl_strcasecompare("identity","identity");
    pcVar4 = pcVar2;
    if (iVar1 == 0) {
      builtin_strncpy(pcVar2,"identity",9);
      sVar3 = strlen(pcVar2);
      (pcVar2 + sVar3)[0] = ',';
      (pcVar2 + sVar3)[1] = ' ';
      pcVar4 = pcVar2 + sVar3 + 2;
    }
    pcVar4[-2] = '\0';
  }
  return pcVar2;
}

Assistant:

char *Curl_all_content_encodings(void)
{
  size_t len = 0;
  const content_encoding * const *cep;
  const content_encoding *ce;
  char *ace;

  for(cep = encodings; *cep; cep++) {
    ce = *cep;
    if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT))
      len += strlen(ce->name) + 2;
  }

  if(!len)
    return strdup(CONTENT_ENCODING_DEFAULT);

  ace = malloc(len);
  if(ace) {
    char *p = ace;
    for(cep = encodings; *cep; cep++) {
      ce = *cep;
      if(!strcasecompare(ce->name, CONTENT_ENCODING_DEFAULT)) {
        strcpy(p, ce->name);
        p += strlen(p);
        *p++ = ',';
        *p++ = ' ';
      }
    }
    p[-2] = '\0';
  }

  return ace;
}